

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O2

hrgls_Status hrgls_APICreateParametersDestroy(hrgls_APICreateParams params)

{
  if (params != (hrgls_APICreateParams)0x0) {
    hrgls_APICreateParams_::~hrgls_APICreateParams_(params);
    operator_delete(params);
    return 0;
  }
  return 0x3ec;
}

Assistant:

hrgls_Status hrgls_APICreateParametersDestroy(hrgls_APICreateParams params)
  {
    hrgls_Status s = hrgls_STATUS_OKAY;
    if (!params) {
      return hrgls_STATUS_DELETE_OF_NULL_POINTER;
    }
    try {
      delete params;
    } catch (...) {
      s = hrgls_STATUS_DELETION_FAILED;
    }
    return s;
  }